

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O3

vectorTy * __thiscall
DataRefs::GetSimWind(vectorTy *__return_storage_ptr__,DataRefs *this,double alt_m)

{
  pointer pWVar1;
  pointer pWVar2;
  pointer pWVar3;
  long lVar4;
  long lVar5;
  pointer pWVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  pWVar1 = (this->lastWind).
           super__Vector_base<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>._M_impl
           .super__Vector_impl_data._M_start;
  pWVar2 = (this->lastWind).
           super__Vector_base<DataRefs::WindLayerTy,_std::allocator<DataRefs::WindLayerTy>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pWVar1 == pWVar2) {
    dVar8 = 0.0;
    dVar7 = 0.0;
    goto LAB_00132ea9;
  }
  lVar5 = (long)pWVar2 - (long)pWVar1;
  if ((NAN(alt_m) || lVar5 == 0x18) || (alt_m <= pWVar1->alt_m)) {
LAB_00132ea4:
    dVar8 = pWVar1->spd_msc;
    dVar7 = pWVar1->dir_degt;
  }
  else {
    lVar4 = (lVar5 >> 3) * -0x5555555555555555 >> 2;
    pWVar3 = pWVar1;
    if (0 < lVar4) {
      pWVar3 = pWVar1 + lVar4 * 4;
      lVar4 = lVar4 + 1;
      pWVar6 = pWVar1 + 2;
      do {
        dVar7 = pWVar6[-2].alt_m;
        if (alt_m <= dVar7) {
          pWVar6 = pWVar6 + -2;
          goto LAB_00132e2a;
        }
        dVar7 = pWVar6[-1].alt_m;
        if (alt_m <= dVar7) {
          pWVar6 = pWVar6 + -1;
          goto LAB_00132e2a;
        }
        dVar7 = pWVar6->alt_m;
        if (alt_m <= dVar7) goto LAB_00132e2a;
        dVar7 = pWVar6[1].alt_m;
        if (alt_m <= dVar7) {
          pWVar6 = pWVar6 + 1;
          goto LAB_00132e2a;
        }
        lVar4 = lVar4 + -1;
        pWVar6 = pWVar6 + 4;
      } while (1 < lVar4);
      lVar5 = (long)pWVar2 - (long)pWVar3;
    }
    lVar5 = (lVar5 >> 3) * -0x5555555555555555;
    if (lVar5 == 1) {
LAB_00132dfa:
      dVar7 = pWVar3->alt_m;
      pWVar6 = pWVar3;
      if (alt_m <= dVar7) goto LAB_00132e2a;
    }
    else {
      if (lVar5 == 2) {
LAB_00132dec:
        dVar7 = pWVar3->alt_m;
        pWVar6 = pWVar3;
        if (dVar7 < alt_m) {
          pWVar3 = pWVar3 + 1;
          goto LAB_00132dfa;
        }
      }
      else {
        if (lVar5 != 3) goto LAB_00132ec8;
        dVar7 = pWVar3->alt_m;
        pWVar6 = pWVar3;
        if (dVar7 < alt_m) {
          pWVar3 = pWVar3 + 1;
          goto LAB_00132dec;
        }
      }
LAB_00132e2a:
      if (pWVar6 != pWVar2) {
        if (pWVar6 != pWVar1) {
          dVar9 = (alt_m - pWVar6[-1].alt_m) / (dVar7 - pWVar6[-1].alt_m);
          dVar8 = (1.0 - dVar9) * pWVar6[-1].spd_msc + pWVar6->spd_msc * dVar9;
          dVar7 = HeadingDiff(pWVar6[-1].dir_degt,pWVar6->dir_degt);
          dVar7 = HeadingNormalize(dVar7 * dVar9 + pWVar6[-1].dir_degt);
          goto LAB_00132ea9;
        }
        goto LAB_00132ea4;
      }
    }
LAB_00132ec8:
    dVar8 = pWVar2[-1].spd_msc;
    dVar7 = pWVar2[-1].dir_degt;
  }
LAB_00132ea9:
  __return_storage_ptr__->angle = dVar7;
  __return_storage_ptr__->dist = NAN;
  __return_storage_ptr__->vsi = NAN;
  __return_storage_ptr__->speed = dVar8;
  return __return_storage_ptr__;
}

Assistant:

const vectorTy DataRefs::GetSimWind (double alt_m) const
{
    // No wind layers known? -> return "no wind"
    if (lastWind.empty())
        return vectorTy(0.0, NAN, NAN, 0.0);
    // Just one wind layer? Or plane is lower than first layer? -> return first layer's wind
    if (lastWind.size() == 1 || std::isnan(alt_m) || alt_m <= lastWind[0].alt_m)
        return vectorTy(lastWind.front().dir_degt, NAN, NAN, lastWind.front().spd_msc);
    // More than one layer and plane is flying higher than first layer
    // Find the fist layer, which is higher than the plane
    auto iter = std::find_if(lastWind.cbegin(), lastWind.cend(),
                             [alt_m](const WindLayerTy& wl){ return alt_m <= wl.alt_m; });
    // If not found, then plane is flying higher than highest layer -> return highest wind
    if (iter == lastWind.cend())
        return vectorTy(lastWind.back().dir_degt, NAN, NAN, lastWind.back().spd_msc);
    // else we found a higher wind layer, but is it right away the first?
    // (should not happen...but just to be on the safe side we catch the case)
    if (iter == lastWind.cbegin())
        return vectorTy(lastWind.front().dir_degt, NAN, NAN, lastWind.front().spd_msc);
    // Now really...plane is in the middle between two layers
    // return an average value between them
    const WindLayerTy& low = *std::prev(iter);
    const WindLayerTy& hgh = *iter;
    const double f = (alt_m - low.alt_m) / (hgh.alt_m - low.alt_m);     // factor how much to use the higher value, should be between 0 and 1
    const double spd = (1.0-f) * low.spd_msc + f * hgh.spd_msc;         // average of speed
    const double hdg_diff = HeadingDiff(low.dir_degt, hgh.dir_degt);    // heading diff
    const double hdg = low.dir_degt + f*hdg_diff;                       // "average" of heading
    return vectorTy(HeadingNormalize(hdg), NAN, NAN, spd);
}